

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

char * sx_os_path_unixpath(char *dst,int size,char *path)

{
  int var__a;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  char cVar4;
  
  uVar1 = sx_strlen(path);
  uVar3 = size - 1U;
  if ((int)uVar1 < (int)(size - 1U)) {
    uVar3 = uVar1;
  }
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      cVar4 = path[uVar2];
      if (path[uVar2] == '\\') {
        cVar4 = '/';
      }
      dst[uVar2] = cVar4;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  dst[(int)uVar3] = '\0';
  return dst;
}

Assistant:

char* sx_os_path_unixpath(char* dst, int size, const char* path)
{
    int len = sx_strlen(path);
    len = sx_min(len, size - 1);

    for (int i = 0; i < len; i++) {
        if (path[i] != '\\')
            dst[i] = path[i];
        else
            dst[i] = '/';
    }
    dst[len] = '\0';
    return dst;
}